

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O3

int __thiscall geemuboi::core::CPU::add_a_d8(CPU *this)

{
  uint8_t *puVar1;
  IMmu *pIVar2;
  Registers *pRVar3;
  Registers *pRVar4;
  uint uVar5;
  byte bVar6;
  uint8_t uVar7;
  byte bVar8;
  
  pIVar2 = this->mmu;
  pRVar3 = this->regs;
  pRVar3->pc = pRVar3->pc + 1;
  uVar5 = (**pIVar2->_vptr_IMmu)();
  pRVar4 = this->regs;
  pRVar4->f = '\0';
  bVar6 = (0xf < (uVar5 & 0xf) + (pRVar3->a & 0xf)) << 5;
  pRVar4->f = bVar6;
  bVar8 = pRVar3->a;
  if (0xff < (uint)bVar8 + (uVar5 & 0xff)) {
    pRVar4->f = bVar6 | 0x10;
    bVar8 = pRVar3->a;
  }
  uVar7 = bVar8 + (char)uVar5;
  pRVar3->a = uVar7;
  if (uVar7 == '\0') {
    puVar1 = &this->regs->f;
    *puVar1 = *puVar1 | 0x80;
  }
  return 2;
}

Assistant:

int CPU::add_a_d8() {
    add_r8_r8(regs.a, mmu.read_byte(regs.pc++));
    return 2;
}